

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O2

bool test_uintwide_t_edge::test_import_bits(void)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar4;
  unsigned_long uVar5;
  uintwide_t<256U,_unsigned_short,_void,_false> *x;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_01;
  uintwide_t<256U,_unsigned_short,_void,_false> *x_02;
  long lVar6;
  long lVar7;
  ulong in_R8;
  int iVar8;
  uint uVar9;
  local_representation_type bits;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen;
  local_boost_small_uint_type val_boost;
  local_uintwide_t_small_unsigned_type val_uintwide_t;
  string str_uintwide_t;
  string str_boost;
  string str_boost_2;
  
  uVar5 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
          *)eng_sgn,uVar5);
  uVar5 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
          *)eng_dig,uVar5);
  bVar3 = true;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    for (uVar9 = 0; uVar9 != 0x400; uVar9 = uVar9 + 0x10) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&u_gen,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
      bits.super_array<unsigned_short,_16UL>.elems[10] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[10];
      bits.super_array<unsigned_short,_16UL>.elems[0xb] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xb];
      bits.super_array<unsigned_short,_16UL>.elems[8] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[8];
      bits.super_array<unsigned_short,_16UL>.elems[9] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[9];
      bits.super_array<unsigned_short,_16UL>.elems[0xe] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xe];
      bits.super_array<unsigned_short,_16UL>.elems[0xf] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xf];
      bits.super_array<unsigned_short,_16UL>.elems[0xc] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xc];
      bits.super_array<unsigned_short,_16UL>.elems[0xd] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xd];
      bits.super_array<unsigned_short,_16UL>.elems[2] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[2];
      bits.super_array<unsigned_short,_16UL>.elems[3] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[3];
      bits.super_array<unsigned_short,_16UL>.elems[0] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0];
      bits.super_array<unsigned_short,_16UL>.elems[1] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[1];
      bits.super_array<unsigned_short,_16UL>.elems[6] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[6];
      bits.super_array<unsigned_short,_16UL>.elems[7] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[7];
      bits.super_array<unsigned_short,_16UL>.elems[4] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[4];
      bits.super_array<unsigned_short,_16UL>.elems[5] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[5];
      bVar2 = test_import_bits::msv_options._M_elems[lVar6];
      if (bVar2 == true) {
        std::__reverse<unsigned_short*>(&bits,&u_gen);
      }
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
      val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t(&val_uintwide_t)
      ;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[2] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[3] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[0] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[1] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_limbs = 1;
      math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                (&val_uintwide_t,(unsigned_short *)&bits,(unsigned_short *)&u_gen,~uVar9 & 0x10,
                 bVar2);
      in_R8 = (ulong)bVar2;
      boost::multiprecision::
      import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const>
                ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&val_boost,(unsigned_short *)&bits,(unsigned_short *)&u_gen,~uVar9 & 0x10,bVar2)
      ;
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&str_uintwide_t,(wide_integer *)&val_uintwide_t,x);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::str_abi_cxx11_(&str_boost,
                       (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                        *)&val_boost,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      _Var1 = std::operator==(&str_uintwide_t,&str_boost);
      if (_Var1) {
        bVar2 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                          (&u_gen,&val_uintwide_t);
        bVar3 = (bool)(bVar2 & bVar3);
      }
      else {
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&str_boost);
      std::__cxx11::string::~string((string *)&str_uintwide_t);
    }
  }
  for (lVar6 = 0; lVar7 = 0, lVar6 != 2; lVar6 = lVar6 + 1) {
    for (; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      iVar8 = 0x40;
      while (bVar2 = iVar8 != 0, iVar8 = iVar8 + -1, bVar2) {
        generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                  (&u_gen,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
        bits.super_array<unsigned_short,_16UL>.elems[10] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[10];
        bits.super_array<unsigned_short,_16UL>.elems[0xb] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[0xb];
        bits.super_array<unsigned_short,_16UL>.elems[8] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[8];
        bits.super_array<unsigned_short,_16UL>.elems[9] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[9];
        bits.super_array<unsigned_short,_16UL>.elems[0xe] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[0xe];
        bits.super_array<unsigned_short,_16UL>.elems[0xf] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[0xf];
        bits.super_array<unsigned_short,_16UL>.elems[0xc] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[0xc];
        bits.super_array<unsigned_short,_16UL>.elems[0xd] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[0xd];
        bits.super_array<unsigned_short,_16UL>.elems[2] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[2];
        bits.super_array<unsigned_short,_16UL>.elems[3] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[3];
        bits.super_array<unsigned_short,_16UL>.elems[0] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[0];
        bits.super_array<unsigned_short,_16UL>.elems[1] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[1];
        bits.super_array<unsigned_short,_16UL>.elems[6] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[6];
        bits.super_array<unsigned_short,_16UL>.elems[7] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[7];
        bits.super_array<unsigned_short,_16UL>.elems[4] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[4];
        bits.super_array<unsigned_short,_16UL>.elems[5] =
             u_gen.values.super_array<unsigned_short,_16UL>.elems[5];
        bVar2 = test_import_bits::msv_options._M_elems[lVar6];
        if (bVar2 == true) {
          std::__reverse<unsigned_short*>(&bits,&u_gen);
        }
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[0] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[1] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[2] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[3] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
        val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                  (&val_uintwide_t);
        val_boost.m_backend.
        super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
        .m_wrapper.m_data[2] = 0;
        val_boost.m_backend.
        super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
        .m_wrapper.m_data[3] = 0;
        val_boost.m_backend.
        super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
        .m_wrapper.m_data[0] = 0;
        val_boost.m_backend.
        super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
        .m_wrapper.m_data[1] = 0;
        val_boost.m_backend.
        super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
        .m_limbs = 1;
        uVar9 = *(uint *)((long)test_import_bits::bits_for_chunks._M_elems + lVar7);
        math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                  (&val_uintwide_t,(unsigned_short *)&bits,(unsigned_short *)&u_gen,uVar9,bVar2);
        in_R8 = (ulong)bVar2;
        boost::multiprecision::
        import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const>
                  (&val_boost,(unsigned_short *)&bits,(unsigned_short *)&u_gen,uVar9,bVar2);
        math::wide_integer::to_string<256u,unsigned_short,void,false>
                  (&str_uintwide_t,(wide_integer *)&val_uintwide_t,x_00);
        boost::multiprecision::backends::
        cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
        ::str_abi_cxx11_(&str_boost,
                         (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                          *)&val_boost,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
        _Var1 = std::operator==(&str_uintwide_t,&str_boost);
        bVar3 = (bool)(bVar3 & _Var1);
        std::__cxx11::string::~string((string *)&str_boost);
        std::__cxx11::string::~string((string *)&str_uintwide_t);
      }
    }
  }
  for (; lVar7 != 2; lVar7 = lVar7 + 1) {
    for (iVar8 = 0; iVar8 != 0x40; iVar8 = iVar8 + 1) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&u_gen,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
      bits.super_array<unsigned_short,_16UL>.elems[2] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[2];
      bits.super_array<unsigned_short,_16UL>.elems[3] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[3];
      bits.super_array<unsigned_short,_16UL>.elems[0] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0];
      bits.super_array<unsigned_short,_16UL>.elems[1] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[1];
      bits.super_array<unsigned_short,_16UL>.elems[6] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[6];
      bits.super_array<unsigned_short,_16UL>.elems[7] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[7];
      bits.super_array<unsigned_short,_16UL>.elems[4] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[4];
      bits.super_array<unsigned_short,_16UL>.elems[5] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[5];
      bits.super_array<unsigned_short,_16UL>.elems[10] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[10];
      bits.super_array<unsigned_short,_16UL>.elems[0xb] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xb];
      bits.super_array<unsigned_short,_16UL>.elems[8] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[8];
      bits.super_array<unsigned_short,_16UL>.elems[9] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[9];
      bits.super_array<unsigned_short,_16UL>.elems[0xe] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xe];
      bits.super_array<unsigned_short,_16UL>.elems[0xf] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xf];
      bits.super_array<unsigned_short,_16UL>.elems[0xc] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xc];
      bits.super_array<unsigned_short,_16UL>.elems[0xd] =
           u_gen.values.super_array<unsigned_short,_16UL>.elems[0xd];
      for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 4) {
        *(undefined4 *)((long)val_uintwide_t.values.super_array<unsigned_short,_16UL>.elems + lVar6)
             = *(undefined4 *)((long)bits.super_array<unsigned_short,_16UL>.elems + lVar6);
      }
      str_uintwide_t.field_2._M_allocated_capacity = 0;
      str_uintwide_t.field_2._8_8_ = 0;
      str_uintwide_t._M_dataplus._M_p = (pointer)0x0;
      str_uintwide_t._M_string_length = 0;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_uintwide_t);
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[2] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[3] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[0] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[1] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_limbs = 1;
      bVar2 = test_import_bits::msv_options._M_elems[lVar7];
      math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&str_uintwide_t,
                 (uint *)&val_uintwide_t,(uint *)&str_uintwide_t,0x20,bVar2);
      in_R8 = (ulong)bVar2;
      boost::multiprecision::
      import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const>
                (&val_boost,(uint *)&val_uintwide_t,(uint *)&str_uintwide_t,0x20,bVar2);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&str_boost,(wide_integer *)&str_uintwide_t,x_01);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::str_abi_cxx11_(&str_boost_2,
                       (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                        *)&val_boost,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      _Var1 = std::operator==(&str_boost,&str_boost_2);
      bVar3 = (bool)(bVar3 & _Var1);
      std::__cxx11::string::~string((string *)&str_boost_2);
      std::__cxx11::string::~string((string *)&str_boost);
    }
  }
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    for (iVar8 = 0; iVar8 != 0x40; iVar8 = iVar8 + 1) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&u_gen,(test_uintwide_t_edge *)0x1,false,0x4d,(int)in_R8);
      for (lVar7 = 0; lVar7 != 0x1c; lVar7 = lVar7 + 4) {
        *(undefined4 *)((long)&str_boost_2._M_dataplus._M_p + lVar7) =
             *(undefined4 *)((long)&str_boost._M_dataplus._M_p + lVar7);
      }
      bits.super_array<unsigned_short,_16UL>.elems[8] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[9] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[10] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[0] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[1] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[2] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[3] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[4] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[5] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[6] = 0;
      bits.super_array<unsigned_short,_16UL>.elems[7] = 0;
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&bits);
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[2] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[3] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[0] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_wrapper.m_data[1] = 0;
      val_boost.m_backend.
      super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
      .m_limbs = 1;
      bVar2 = test_import_bits::msv_options._M_elems[lVar6];
      math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&bits,(uint *)&str_boost_2,
                 (uint *)(str_boost_2.field_2._M_local_buf + 0xc),0x20,bVar2);
      in_R8 = (ulong)bVar2;
      boost::multiprecision::
      import_bits<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const>
                (&val_boost,(uint *)&str_boost_2,(uint *)(str_boost_2.field_2._M_local_buf + 0xc),
                 0x20,bVar2);
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                ((string *)&val_uintwide_t,(wide_integer *)&bits,x_02);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::str_abi_cxx11_(&str_uintwide_t,
                       (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                        *)&val_boost,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      _Var1 = std::operator==((string *)&val_uintwide_t,&str_uintwide_t);
      bVar3 = (bool)(bVar3 & _Var1);
      std::__cxx11::string::~string((string *)&str_uintwide_t);
      std::__cxx11::string::~string((string *)&val_uintwide_t);
    }
  }
  u_gen.values.super_array<unsigned_short,_16UL>.elems[0] = 0xaaaa;
  u_gen.values.super_array<unsigned_short,_16UL>.elems[1] = 0x5555;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 4) {
    val_boost.m_backend.
    super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[2] = 0;
    val_boost.m_backend.
    super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[3] = 0;
    val_boost.m_backend.
    super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[0] = 0;
    val_boost.m_backend.
    super_cpp_int_base<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_false>
    .m_wrapper.m_data[1] = 0;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&val_boost);
    math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&val_boost,(uint *)&u_gen,
               (uint *)(u_gen.values.super_array<unsigned_short,_16UL>.elems + 2),
               *(uint *)((long)test_import_bits::various_chunk_sizes._M_elems + lVar6),true);
    eVar4 = math::wide_integer::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&val_boost,
                       (uint *)((long)test_import_bits::various_import_results._M_elems + lVar6));
    bVar3 = (bool)(bVar3 & eVar4);
  }
  return bVar3;
}

Assistant:

auto test_import_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;
      using local_input_value_type    = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      if(msv_first)
      {
        std::reverse(bits.begin(), bits.end());
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      const auto oscillated_chunk_size =
        static_cast<unsigned>
        (
          static_cast<unsigned>(i % 2U) == 0U
            ? static_cast<unsigned>(std::numeric_limits<local_input_value_type>::digits)
            : 0U
        );

      static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first));
      static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first)); // NOLINT

      using std::to_string;

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      = val_boost.str();

      const auto result_import_bits_is_ok = ((str_uintwide_t == str_boost) && (u_gen == val_uintwide_t));

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify import_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

        local_representation_type bits(u_gen.crepresentation());

        if(msv_first)
        {
          std::reverse(bits.begin(), bits.end());
        }

        local_uintwide_t_small_unsigned_type val_uintwide_t { };
        local_boost_small_uint_type          val_boost      { };

        using std::to_string;

        static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), chunk_size, msv_first));
        static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), chunk_size, msv_first)); // NOLINT

        const auto str_uintwide_t = to_string(val_uintwide_t);
        const auto str_boost      =           val_boost.str();

        const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

        result_is_ok = (result_import_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_input_array_type =
        std::array<local_input_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          #if defined(WIDE_INTEGER_NAMESPACE)
          elem = make_large(*WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #else
          elem = make_large(*::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #endif

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // Use various input bit counts exceeding the result limb's width.
      // Use only part of the size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      using local_representation_less_wide_type =
        std::array<local_input_value_type, static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) - 2U)>;

      local_representation_less_wide_type bits { };

      std::copy(u_gen.crepresentation().cbegin(),
                #if defined(WIDE_INTEGER_NAMESPACE)
                WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #else
                ::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #endif
                bits.begin());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_less_wide_input_array_type =
        std::array<local_input_double_width_value_type, std::tuple_size<local_representation_less_wide_type>::value / 2U>;

      static_assert(std::tuple_size<local_double_width_less_wide_input_array_type>::value == static_cast<std::size_t>(static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) / 2U) - 1U),
                    "Error: Type definition widths are not OK");

      local_double_width_less_wide_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          elem = make_large(bits[index], bits[index_plus_one]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  {
    // Additional verification of import_bits().

    const std::array<std::uint32_t, 1U> bits_in = { static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)) };

    using chunk_sizes_array_type = std::array<unsigned, static_cast<std::size_t>(UINT8_C(4))>;

    static const chunk_sizes_array_type various_chunk_sizes =
    {
      0U, 32U, 24U, 2U
    };

    static const std::array<std::uint32_t, std::tuple_size<chunk_sizes_array_type>::value> various_import_results =
    {
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x0055AAAA)),
      static_cast<std::uint32_t>(UINT32_C(2))
    };

    for(auto i = static_cast<std::size_t>(UINT8_C(0)); i < various_chunk_sizes.size(); ++i)
    {
      auto u = local_uintwide_t_small_unsigned_type { };

      static_cast<void>
      (
        import_bits(u, bits_in.cbegin(), bits_in.cend(), various_chunk_sizes[i]) // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)
      );

      const auto result_import_is_ok = (u == various_import_results[i]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

      result_is_ok = (result_import_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}